

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  undefined4 in_register_00000014;
  char *pcVar10;
  FastDtoaMode FVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  ulong uVar16;
  uint64_t rest;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long in_FS_OFFSET;
  DiyFp DVar21;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  int mk;
  int *in_stack_ffffffffffffff68;
  uint64_t in_stack_ffffffffffffff70;
  int local_6c;
  DiyFp local_68;
  DiyFp local_58;
  DiyFp local_48;
  long local_38;
  
  pcVar10 = (char *)CONCAT44(in_register_00000014,requested_digits);
  puVar15 = buffer._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  buffer_01.length_ = (uint)this;
  local_48.f_ = (uint64_t)v;
  if (buffer_01.length_ < 2) {
    DVar21 = Double::AsNormalizedDiyFp((Double *)&local_48);
    iVar4 = DVar21.e_;
    local_48.e_ = 0;
    local_48._12_4_ = 0xaaaaaaaa;
    local_48.f_ = 0;
    local_58.e_ = 0;
    local_58._12_4_ = 0xaaaaaaaa;
    local_58.f_ = 0;
    if (buffer_01.length_ == 0) {
      local_68.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_68,&local_48,&local_58);
    }
    else {
      local_68.f_ = CONCAT44(local_68.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_68,&local_48,&local_58);
    }
    local_68.e_ = 0;
    local_68._12_4_ = 0xaaaaaaaa;
    local_68.f_ = 0;
    local_6c = -0x55555556;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar4,-0x60 - iVar4,&local_68,&local_6c);
    uVar6 = DVar21.f_ & 0xffffffff;
    uVar18 = local_68.f_ & 0xffffffff;
    uVar5 = local_68.f_ >> 0x20;
    uVar14 = uVar5 * uVar6;
    uVar13 = (DVar21.f_ >> 0x20) * uVar18;
    iVar1 = (int)((uVar14 & 0xffffffff) + (uVar13 & 0xffffffff) + (uVar6 * uVar18 >> 0x20) +
                  0x80000000 >> 0x20) +
            (int)(uVar14 >> 0x20) +
            (int)(uVar13 >> 0x20) + (int)(local_68.f_ >> 0x20) * DVar21.f_._4_4_;
    uVar16 = (local_48.f_ & 0xffffffff) * uVar5;
    uVar13 = (local_48.f_ >> 0x20) * uVar18;
    uVar6 = uVar5 * (local_58.f_ & 0xffffffff);
    uVar14 = (local_58.f_ >> 0x20) * uVar18;
    lVar7 = (uVar6 >> 0x20) + (uVar14 >> 0x20) + (local_58.f_ >> 0x20) * uVar5;
    uVar14 = (uVar6 & 0xffffffff) +
             (uVar14 & 0xffffffff) + ((local_58.f_ & 0xffffffff) * uVar18 >> 0x20) + 0x80000000 >>
             0x20;
    uVar17 = uVar14 + lVar7 + 1;
    cVar2 = (char)(local_68.e_ + iVar4);
    bVar8 = -cVar2 - 0x40;
    bVar9 = -cVar2;
    rest = 1L << (bVar9 & 0x3f);
    uVar6 = uVar17 >> (bVar9 & 0x3f);
    uVar18 = ((lVar7 + uVar14) -
             (((uVar16 & 0xffffffff) +
               (uVar13 & 0xffffffff) + ((local_48.f_ & 0xffffffff) * uVar18 >> 0x20) + 0x80000000 >>
              0x20) + (uVar16 >> 0x20) + (uVar13 >> 0x20) + (local_48.f_ >> 0x20) * uVar5)) + 2;
    uVar5 = rest - 1;
    uVar13 = uVar17 & uVar5;
    iVar4 = (local_68.e_ + iVar4) * 0x4d1 + 0x26d51 >> 0xc;
    uVar12 = 1;
    if (*(uint *)(kSmallPowersOfTen + (long)iVar4 * 4 + 4) <= (uint)uVar6) {
      iVar4 = iVar4 + 1;
    }
    uVar14 = (ulong)*(uint *)(kSmallPowersOfTen + (long)iVar4 * 4);
    *puVar15 = 0;
    if (iVar4 < 1) {
      buffer_01.length_ = 0;
    }
    else {
      uVar19 = iVar4 + 1;
      buffer_01.length_ = 0;
      do {
        uVar16 = uVar6 & 0xffffffff;
        uVar6 = uVar16 % uVar14;
        pcVar10[(int)buffer_01.length_] = (char)(uVar16 / uVar14) + '0';
        buffer_01.length_ = *puVar15 + 1;
        *puVar15 = buffer_01.length_;
        uVar16 = (uVar6 << (bVar8 & 0x3f)) + uVar13;
        if (uVar16 < uVar18) {
          buffer_01.start_ = pcVar10;
          buffer_01._12_4_ = 0;
          bVar3 = RoundWeed(buffer_01,(int)uVar17 - iVar1,uVar18,uVar16,uVar14 << (bVar8 & 0x3f),1,
                            in_stack_ffffffffffffff70);
          if (!bVar3) goto LAB_003dddb1;
          iVar4 = (uVar19 - local_6c) + -2;
          goto LAB_003ddd9b;
        }
        uVar14 = uVar14 / 10;
        uVar19 = uVar19 - 1;
      } while (1 < uVar19);
      iVar4 = 0;
    }
    do {
      uVar12 = uVar12 * 10;
      uVar18 = uVar18 * 10;
      pcVar10[(int)buffer_01.length_] = (char)(uVar13 * 10 >> (bVar8 & 0x3f)) + '0';
      buffer_00.length_ = *puVar15 + 1;
      *puVar15 = buffer_00.length_;
      uVar13 = uVar13 * 10 & uVar5;
      iVar4 = iVar4 + -1;
      buffer_01.length_ = buffer_00.length_;
    } while (uVar18 <= uVar13);
    buffer_00.start_ = pcVar10;
    buffer_00._12_4_ = 0;
    bVar3 = RoundWeed(buffer_00,((int)uVar17 - iVar1) * (int)uVar12,uVar18,uVar13,rest,uVar12,
                      in_stack_ffffffffffffff70);
    if (!bVar3) goto LAB_003dddb1;
    iVar4 = iVar4 - local_6c;
LAB_003ddd9b:
    *length = iVar4 + *puVar15;
    pcVar10[(int)*puVar15] = '\0';
    bVar3 = true;
  }
  else {
    if (buffer_01.length_ != 2) {
      abort();
    }
    DVar21 = Double::AsNormalizedDiyFp((Double *)&local_48);
    iVar4 = DVar21.e_;
    local_48.e_ = 0;
    local_48._12_4_ = 0xaaaaaaaa;
    local_48.f_ = 0;
    local_58.f_ = CONCAT44(local_58.f_._4_4_,0xaaaaaaaa);
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar4,-0x60 - iVar4,&local_48,(int *)&local_58);
    uVar6 = DVar21.f_ >> 0x20;
    uVar13 = DVar21.f_ & 0xffffffff;
    uVar5 = (local_48.f_ >> 0x20) * uVar13;
    uVar18 = uVar6 * (local_48.f_ & 0xffffffff);
    cVar2 = (char)(iVar4 + local_48.e_);
    bVar8 = -cVar2 - 0x40;
    bVar9 = -cVar2;
    uVar12 = 1L << (bVar9 & 0x3f);
    uVar6 = ((uVar5 & 0xffffffff) +
             (uVar18 & 0xffffffff) + ((local_48.f_ & 0xffffffff) * uVar13 >> 0x20) + 0x80000000 >>
            0x20) + (uVar5 >> 0x20) + (uVar18 >> 0x20) + (local_48.f_ >> 0x20) * uVar6;
    uVar5 = uVar6 >> (bVar9 & 0x3f);
    uVar6 = uVar6 & uVar12 - 1;
    buffer_01.length_ = (iVar4 + local_48.e_) * 0x4d1 + 0x26d51 >> 0xc;
    uVar19 = (uint)uVar5;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)buffer_01.length_ * 4 + 4) <= uVar19) {
      buffer_01.length_ = buffer_01.length_ + 1;
    }
    uVar13 = (ulong)*(uint *)(kSmallPowersOfTen + (long)(int)buffer_01.length_ * 4);
    *puVar15 = 0;
    uVar18 = 0;
    uVar20 = buffer_01.length_;
    if (0 < (int)buffer_01.length_) {
      do {
        uVar14 = uVar5 & 0xffffffff;
        uVar5 = uVar14 % uVar13;
        uVar19 = (uint)uVar5;
        pcVar10[(int)uVar18] = (char)(uVar14 / uVar13) + '0';
        uVar18 = (ulong)(*puVar15 + 1);
        *puVar15 = *puVar15 + 1;
        buffer_01.length_ = uVar20 - 1;
        if (mode == FAST_DTOA_SHORTEST_SINGLE) {
          local_68.f_ = CONCAT44(local_68.f_._4_4_,buffer_01.length_);
          goto LAB_003ddd67;
        }
        uVar13 = uVar13 / 10;
        mode = mode - FAST_DTOA_SHORTEST_SINGLE;
        bVar3 = 1 < uVar20;
        uVar20 = buffer_01.length_;
      } while (bVar3);
    }
    local_68.f_ = CONCAT44(local_68.f_._4_4_,buffer_01.length_);
    if (mode == FAST_DTOA_SHORTEST) {
LAB_003ddd67:
      iVar4 = (uVar19 << (bVar8 & 0x3f)) + (int)uVar6;
      uVar12 = uVar13 << (bVar8 & 0x3f);
      uVar5 = 1;
LAB_003ddd88:
      buffer_02._8_8_ = uVar18;
      buffer_02.start_ = pcVar10;
      bVar3 = RoundWeedCounted(buffer_02,iVar4,uVar12,uVar5,(uint64_t)&local_68,
                               in_stack_ffffffffffffff68);
      if (bVar3) {
        iVar4 = (int)local_68.f_ - (int)local_58.f_;
        goto LAB_003ddd9b;
      }
    }
    else if ((0 < (int)mode) && (1 < uVar6)) {
      uVar5 = 1;
      do {
        uVar5 = uVar5 * 10;
        pcVar10[(int)uVar18] = (char)(uVar6 * 10 >> (bVar8 & 0x3f)) + '0';
        uVar18 = (ulong)(*puVar15 + 1);
        *puVar15 = *puVar15 + 1;
        FVar11 = mode - FAST_DTOA_SHORTEST_SINGLE;
        uVar6 = uVar6 * 10 & uVar12 - 1;
        buffer_01.length_ = buffer_01.length_ - 1;
        if (mode < FAST_DTOA_PRECISION) break;
        mode = FVar11;
      } while (uVar5 < uVar6);
      local_68.f_ = CONCAT44(local_68.f_._4_4_,buffer_01.length_);
      if (FVar11 == FAST_DTOA_SHORTEST) {
        iVar4 = (int)uVar6;
        goto LAB_003ddd88;
      }
    }
LAB_003dddb1:
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}